

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufile_mput.c
# Opt level: O3

ufile_error
ufile_multiple_upload_init(ufile_mutipart_state *self,char *bucket_name,char *key,char *mime_type)

{
  uint uVar1;
  int iVar2;
  CURL *curl;
  cJSON *pcVar3;
  char *pcVar4;
  list_node *node;
  curls_list *pcVar5;
  etag_slist *peVar6;
  char *pcVar7;
  cJSON *pcVar8;
  ufile_error uVar9;
  http_options opt;
  char tmp [1024];
  http_options local_488;
  cJSON *local_468;
  char *local_460;
  undefined8 local_458;
  char *local_450;
  undefined8 local_448;
  undefined8 local_440;
  char local_438 [1032];
  
  uVar9 = check_bucket_key(bucket_name,key);
  pcVar7 = uVar9.message;
  uVar1 = uVar9.code;
  if (uVar1 == 0 || uVar1 - 200 < 100) {
    curl = (CURL *)curl_easy_init();
    if (curl == (CURL *)0x0) {
      pcVar7 = "init curl failed.";
      uVar1 = 0xffffffec;
    }
    else {
      local_488.method = (char *)0x0;
      local_488.url = (char *)0x0;
      local_488.header = (curl_slist *)0x0;
      uVar9 = set_http_options(&local_488,"POST",mime_type,bucket_name,key,"uploads");
      pcVar7 = uVar9.message;
      uVar1 = uVar9.code;
      if (uVar1 - 200 < 100 || uVar1 == 0) {
        local_460 = mime_type;
        set_curl_options(curl,&local_488);
        local_458 = 0;
        memset(local_438,0,0x400);
        local_448 = 0x400;
        local_440 = 0;
        local_450 = local_438;
        curl_easy_setopt(curl,0x4e2b,http_write_cb);
        curl_easy_setopt(curl,0x2711,&local_458);
        uVar9 = curl_do(curl);
        pcVar7 = uVar9.message;
        uVar1 = uVar9.code;
        if (uVar1 - 200 < 100 || uVar1 == 0) {
          pcVar3 = cJSON_Parse(local_438);
          if (pcVar3 == (cJSON *)0x0) {
            pcVar7 = cJSON_GetErrorPtr();
            http_cleanup(curl,&local_488);
            uVar1 = 0xfffffffd;
          }
          else {
            http_cleanup((CURL *)0x0,&local_488);
            local_468 = pcVar3;
            for (pcVar8 = pcVar3->child; pcVar8 != (cJSON *)0x0; pcVar8 = pcVar8->next) {
              pcVar4 = pcVar8->string;
              iVar2 = strcmp(pcVar4,"BlkSize");
              if (iVar2 == 0) {
                self->part_size = (long)pcVar8->valueint;
              }
              else {
                iVar2 = strcmp(pcVar4,"UploadId");
                if (iVar2 == 0) {
                  pcVar4 = ufile_strconcat(pcVar8->valuestring,0);
                  self->upload_id = pcVar4;
                }
              }
            }
            cJSON_Delete(local_468);
            node = (list_node *)malloc(0x10);
            node->curl = curl;
            node->next = (list_node *)0x0;
            pcVar5 = save_curl_handle((curls_list *)0x0,node);
            self->curls = pcVar5;
            pcVar4 = ufile_strconcat(bucket_name);
            self->bucket_name = pcVar4;
            pcVar4 = ufile_strconcat(key);
            self->key = pcVar4;
            pcVar4 = ufile_strconcat(local_460);
            self->mime_type = pcVar4;
            peVar6 = (etag_slist *)malloc(0x40);
            self->etags = peVar6;
            peVar6->etag_buf = (char *)0x0;
            peVar6->pos = 0;
            peVar6->cap = 0;
            pthread_mutex_init((pthread_mutex_t *)&peVar6->mutex,(pthread_mutexattr_t *)0x0);
          }
          goto LAB_00109348;
        }
      }
      http_cleanup(curl,&local_488);
    }
  }
LAB_00109348:
  uVar9._4_4_ = 0;
  uVar9.code = uVar1;
  uVar9.message = pcVar7;
  return uVar9;
}

Assistant:

struct ufile_error
ufile_multiple_upload_init(struct ufile_mutipart_state *self, const char *bucket_name, const char *key, const char* mime_type){
    struct ufile_error error;
    error = check_bucket_key(bucket_name, key);
    if(UFILE_HAS_ERROR(error.code)){
        return error;
    }
    CURL *curl = curl_easy_init();
    if(curl == NULL){
        error.code = CURL_ERROR_CODE;
        error.message = CURL_INIT_ERROR_MSG;
        return error;
    }

    struct http_options opt;
    memset(&opt, 0, sizeof(struct http_options));
    error = set_http_options(&opt, "POST", mime_type, bucket_name, key, "uploads");
    if(UFILE_HAS_ERROR(error.code)){
        http_cleanup(curl, &opt);
        return error;
    }

    set_curl_options(curl, &opt);

    struct http_body response_body;
    memset(&response_body, 0, sizeof(struct http_body));
    char tmp[1024] = {0};
    response_body.buffer = tmp;
    response_body.buffer_size = 1024;
    response_body.pos_n = 0;
    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, http_write_cb);
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, &response_body);

    error = curl_do(curl);
    if(UFILE_HAS_ERROR(error.code)){
        http_cleanup(curl, &opt); //清理 curl，因为没有后续操作。
        return error;
    }
    struct cJSON *json=cJSON_Parse(tmp);
    if(json==NULL){
        error.code = UFILE_MULTIPLE_INIT_ERROR_CODE;
        error.message = cJSON_GetErrorPtr();
        http_cleanup(curl, &opt); //清理 curl，因为没有后续操作。
        return error;
    }
    http_cleanup(NULL, &opt); //curl 不清理，留着后续复用。
    struct cJSON *item = json->child;
    while(item!=NULL){
        if (strcmp(item->string, "BlkSize") == 0){
            self->part_size = item->valueint;
        }else if(strcmp(item->string, "UploadId") == 0){
            self->upload_id = ufile_strconcat(item->valuestring, NULL);
        }
        item=item->next;
    }
    cJSON_Delete(json);

    struct list_node *node = malloc(sizeof(struct list_node));
    node->curl = curl;
    node->next = NULL;
    self->curls = save_curl_handle(NULL, node);

    self->bucket_name = ufile_strconcat(bucket_name, NULL);
    self->key = ufile_strconcat(key, NULL);
    self->mime_type = ufile_strconcat(mime_type, NULL);

    self->etags = malloc(sizeof(struct etag_slist));
    self->etags->cap = 0;
    self->etags->pos = 0;
    self->etags->etag_buf = NULL;
    pthread_mutex_init(&self->etags->mutex, NULL);
    return error;
}